

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_textedit.h
# Opt level: O2

ImWchar * ImStb::stb_text_createundo(StbUndoState *state,int pos,int insert_len,int delete_len)

{
  short sVar1;
  int iVar2;
  
  state->redo_point = 99;
  state->redo_char_point = 999;
  if (state->undo_point == 99) {
    stb_textedit_discard_undo(state);
  }
  if (insert_len < 1000) {
    while (999 < state->undo_char_point + insert_len) {
      stb_textedit_discard_undo(state);
    }
    sVar1 = state->undo_point;
    state->undo_point = sVar1 + 1;
    state->undo_rec[sVar1].where = pos;
    state->undo_rec[sVar1].insert_length = insert_len;
    state->undo_rec[sVar1].delete_length = delete_len;
    if (insert_len != 0) {
      iVar2 = state->undo_char_point;
      state->undo_rec[sVar1].char_storage = iVar2;
      state->undo_char_point = insert_len + iVar2;
      return state->undo_char + iVar2;
    }
    state->undo_rec[sVar1].char_storage = -1;
  }
  else {
    state->undo_point = 0;
    state->undo_char_point = 0;
  }
  return (ImWchar *)0x0;
}

Assistant:

static STB_TEXTEDIT_CHARTYPE *stb_text_createundo(StbUndoState *state, int pos, int insert_len, int delete_len)
{
   StbUndoRecord *r = stb_text_create_undo_record(state, insert_len);
   if (r == NULL)
      return NULL;

   r->where = pos;
   r->insert_length = (STB_TEXTEDIT_POSITIONTYPE) insert_len;
   r->delete_length = (STB_TEXTEDIT_POSITIONTYPE) delete_len;

   if (insert_len == 0) {
      r->char_storage = -1;
      return NULL;
   } else {
      r->char_storage = state->undo_char_point;
      state->undo_char_point += insert_len;
      return &state->undo_char[r->char_storage];
   }
}